

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atcp.c
# Opt level: O2

void nn_atcp_term(nn_atcp *self)

{
  if (self->state == 1) {
    nn_list_item_term(&self->item);
    nn_fsm_event_term(&self->done);
    nn_fsm_event_term(&self->accepted);
    nn_stcp_term(&self->stcp);
    nn_usock_term(&self->usock);
    nn_fsm_term(&self->fsm);
    return;
  }
  nn_backtrace_print();
  fprintf(_stderr,"Assertion failed: %d == %s (%s:%d)\n",(ulong)(uint)self->state,
          "NN_ATCP_STATE_IDLE",
          "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/tcp/atcp.c"
          ,0x4d);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

void nn_atcp_term (struct nn_atcp *self)
{
    nn_assert_state (self, NN_ATCP_STATE_IDLE);

    nn_list_item_term (&self->item);
    nn_fsm_event_term (&self->done);
    nn_fsm_event_term (&self->accepted);
    nn_stcp_term (&self->stcp);
    nn_usock_term (&self->usock);
    nn_fsm_term (&self->fsm);
}